

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.h
# Opt level: O0

void __thiscall kiste::line_data_t::line_data_t(line_data_t *this,line_data_t *param_1)

{
  line_data_t *param_1_local;
  line_data_t *this_local;
  
  this->_type = param_1->_type;
  std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
            (&this->_segments,&param_1->_segments);
  class_t::class_t(&this->_class_data,&param_1->_class_data);
  member_t::member_t(&this->_member,&param_1->_member);
  return;
}

Assistant:

line_data_t(const line_data_t&) = default;